

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

Expression *
slang::ast::Expression::convertAssignment
          (ASTContext *context,Type *type,Expression *expr,SourceLocation location,
          Expression **lhsExpr,bitmask<slang::ast::AssignFlags> *assignFlags)

{
  SourceRange *pSVar1;
  Symbol *pSVar2;
  bool bVar3;
  bitwidth_t bVar4;
  bitwidth_t bVar5;
  StreamingConcatenationExpression *rhs;
  OpenRangeExpression *this;
  Expression *pEVar6;
  Expression *pEVar7;
  Type *pTVar8;
  Diagnostic *diag_00;
  Expression *pEVar9;
  byte local_172;
  bool local_171;
  bool local_161;
  bitmask<slang::ast::ASTFlags> local_120;
  ASTContext *local_118;
  byte local_109;
  bool expanding;
  SourceLocation local_100;
  Expression *local_f8;
  SourceLocation local_f0;
  undefined8 local_e8;
  ASTContext *local_e0;
  DiagCode local_d4;
  Diagnostic *local_d0;
  Diagnostic *diag;
  DiagCode local_bc;
  ASTContext *pAStack_b8;
  DiagCode code;
  Expression *right;
  Expression *left;
  OpenRangeExpression *ore;
  ASTContext *local_88;
  ASTContext *local_80;
  SourceLocation local_78;
  Expression *conn_1;
  Expression *local_68;
  Expression *conn;
  InstanceSymbolBase *instance;
  Type *rt;
  Expression *result;
  Compilation *comp;
  bitmask<slang::ast::AssignFlags> *assignFlags_local;
  Expression **lhsExpr_local;
  Expression *expr_local;
  Type *type_local;
  ASTContext *context_local;
  SourceLocation location_local;
  
  comp = (Compilation *)assignFlags;
  assignFlags_local = (bitmask<slang::ast::AssignFlags> *)lhsExpr;
  lhsExpr_local = (Expression **)expr;
  expr_local = (Expression *)type;
  type_local = (Type *)context;
  context_local = (ASTContext *)location;
  bVar3 = bad(expr);
  if (bVar3) {
    location_local = (SourceLocation)lhsExpr_local;
  }
  else {
    result = (Expression *)ASTContext::getCompilation((ASTContext *)type_local);
    bVar3 = Type::isError((Type *)expr_local);
    if (bVar3) {
      location_local = (SourceLocation)badExpr((Compilation *)result,(Expression *)lhsExpr_local);
    }
    else {
      rt = (Type *)lhsExpr_local;
      instance = (InstanceSymbolBase *)
                 not_null::operator_cast_to_Type_((not_null *)(lhsExpr_local + 1));
      bVar3 = Type::isEquivalent((Type *)expr_local,(Type *)instance);
      if (bVar3) {
        selfDetermined((ASTContext *)type_local,(Expression **)&rt);
        location_local = (SourceLocation)rt;
      }
      else {
        conn = (Expression *)ASTContext::getInstance((ASTContext *)type_local);
        if (((InstanceSymbolBase *)conn != (InstanceSymbolBase *)0x0) &&
           (bVar3 = nonstd::span_lite::span<const_int,_18446744073709551615UL>::empty
                              (&((InstanceSymbolBase *)conn)->arrayPath), !bVar3)) {
          bVar4 = Type::getBitWidth((Type *)expr_local);
          bVar5 = Type::getBitWidth((Type *)instance);
          if ((bVar4 != bVar5) ||
             (bVar3 = Type::isAssignmentCompatible((Type *)expr_local,(Type *)instance), !bVar3)) {
            if (assignFlags_local == (bitmask<slang::ast::AssignFlags> *)0x0) {
              local_78 = (SourceLocation)
                         tryConnectPortArray((Expression *)type_local,(ASTContext *)expr_local,
                                             (Type *)lhsExpr_local,conn,
                                             (InstanceSymbolBase *)lhsExpr);
              if (local_78 != (SourceLocation)0x0) {
                selfDetermined((ASTContext *)type_local,(Expression **)&local_78);
                return (Expression *)local_78;
              }
              local_78 = (SourceLocation)0x0;
            }
            else {
              local_68 = tryConnectPortArray((Expression *)type_local,(ASTContext *)instance,
                                             *(Type **)assignFlags_local,conn,
                                             (InstanceSymbolBase *)lhsExpr);
              if (local_68 != (Expression *)0x0) {
                selfDetermined((ASTContext *)type_local,&local_68);
                *(Expression **)assignFlags_local = local_68;
                if (comp != (Compilation *)0x0) {
                  if (comp != (Compilation *)0x0) {
                    bitmask<slang::ast::AssignFlags>::bitmask
                              ((bitmask<slang::ast::AssignFlags> *)((long)&conn_1 + 4),SlicedPort);
                    bitmask<slang::ast::AssignFlags>::operator|=
                              ((bitmask<slang::ast::AssignFlags> *)comp,
                               (bitmask<slang::ast::AssignFlags> *)((long)&conn_1 + 4));
                  }
                  selfDetermined((ASTContext *)type_local,(Expression **)&rt);
                  return (Expression *)rt;
                }
                assert::assertFailed
                          ("assignFlags",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                           ,0x111,
                           "static Expression &slang::ast::Expression::convertAssignment(const ASTContext &, const Type &, Expression &, SourceLocation, Expression **, bitmask<AssignFlags> *)"
                          );
              }
              local_68 = (Expression *)0x0;
            }
          }
        }
        bVar3 = Type::isAssignmentCompatible((Type *)expr_local,(Type *)instance);
        if (bVar3) {
          bVar3 = Type::isNumeric((Type *)expr_local);
          if ((bVar3) && (bVar3 = Type::isNumeric((Type *)instance), bVar3)) {
            pSVar2 = &type_local->super_Symbol;
            bitmask<slang::ast::ASTFlags>::bitmask
                      ((bitmask<slang::ast::ASTFlags> *)&stack0xfffffffffffffef8,EnumInitializer);
            bVar3 = bitmask<slang::ast::ASTFlags>::has
                              ((bitmask<slang::ast::ASTFlags> *)&(pSVar2->name)._M_str,
                               (bitmask<slang::ast::ASTFlags> *)&stack0xfffffffffffffef8);
            local_172 = 0;
            if (bVar3) {
              bVar3 = anon_unknown.dwarf_cfc23d::checkEnumInitializer
                                ((ASTContext *)type_local,(Type *)expr_local,(Expression *)rt);
              local_172 = bVar3 ^ 0xff;
            }
            if ((local_172 & 1) != 0) {
              pEVar9 = badExpr((Compilation *)result,(Expression *)lhsExpr_local);
              return pEVar9;
            }
            instance = (InstanceSymbolBase *)
                       binaryOperatorType((Compilation *)result,(Type *)expr_local,(Type *)instance,
                                          false,true);
            local_109 = Type::isEquivalent((Type *)expr_local,(Type *)instance);
            if ((bool)local_109) {
              instance = (InstanceSymbolBase *)expr_local;
            }
            local_118 = context_local;
            contextDetermined((ASTContext *)type_local,(Expression **)&rt,(Type *)instance,
                              (SourceLocation)context_local);
            if ((local_109 & 1) != 0) {
              return (Expression *)rt;
            }
            pSVar2 = &type_local->super_Symbol;
            bitmask<slang::ast::ASTFlags>::bitmask(&local_120,EnumInitializer);
            bVar3 = bitmask<slang::ast::ASTFlags>::has
                              ((bitmask<slang::ast::ASTFlags> *)&(pSVar2->name)._M_str,&local_120);
            if (bVar3) {
              selfDetermined((ASTContext *)type_local,(Expression **)&rt);
              return (Expression *)rt;
            }
          }
          location_local =
               (SourceLocation)
               ConversionExpression::makeImplicit
                         ((ASTContext *)type_local,(Type *)expr_local,Implicit,(Expression *)rt,
                          (SourceLocation)context_local);
        }
        else {
          bVar3 = isImplicitlyAssignableTo
                            ((Expression *)lhsExpr_local,(Compilation *)result,(Type *)expr_local);
          pEVar9 = expr_local;
          if (bVar3) {
            local_80 = context_local;
            location_local =
                 (SourceLocation)
                 ConversionExpression::makeImplicit
                           ((ASTContext *)type_local,(Type *)expr_local,Implicit,(Expression *)rt,
                            (SourceLocation)context_local);
          }
          else if (*(int *)lhsExpr_local == 0x11) {
            rhs = as<slang::ast::StreamingConcatenationExpression>((Expression *)lhsExpr_local);
            local_88 = context_local;
            bVar3 = Bitstream::canBeSource
                              ((Type *)pEVar9,rhs,(SourceLocation)context_local,
                               (ASTContext *)type_local);
            if (bVar3) {
              ore._4_4_ = 2;
              rt = (Type *)BumpAllocator::
                           emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind,slang::ast::Expression&,slang::SourceRange&>
                                     ((BumpAllocator *)result,(Type *)expr_local,
                                      (ConversionKind *)((long)&ore + 4),(Expression *)rt,
                                      (SourceRange *)&(rt->super_Symbol).parentScope);
              selfDetermined((ASTContext *)type_local,(Expression **)&rt);
              location_local = (SourceLocation)rt;
            }
            else {
              location_local =
                   (SourceLocation)badExpr((Compilation *)result,(Expression *)lhsExpr_local);
            }
          }
          else if (*(int *)lhsExpr_local == 0x1f) {
            this = as<slang::ast::OpenRangeExpression>((Expression *)lhsExpr_local);
            pTVar8 = type_local;
            pEVar9 = expr_local;
            pEVar6 = OpenRangeExpression::left(this);
            pEVar6 = convertAssignment((ASTContext *)pTVar8,(Type *)pEVar9,pEVar6,
                                       (SourceLocation)context_local,
                                       (Expression **)assignFlags_local,
                                       (bitmask<slang::ast::AssignFlags> *)comp);
            pTVar8 = type_local;
            pEVar9 = expr_local;
            pEVar7 = OpenRangeExpression::right(this);
            pAStack_b8 = context_local;
            pEVar7 = convertAssignment((ASTContext *)pTVar8,(Type *)pEVar9,pEVar7,
                                       (SourceLocation)context_local,
                                       (Expression **)assignFlags_local,
                                       (bitmask<slang::ast::AssignFlags> *)comp);
            pEVar9 = result;
            pTVar8 = not_null<const_slang::ast::Type_*>::operator*
                               ((not_null<const_slang::ast::Type_*> *)(lhsExpr_local + 1));
            location_local =
                 (SourceLocation)
                 BumpAllocator::
                 emplace<slang::ast::OpenRangeExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                           ((BumpAllocator *)pEVar9,pTVar8,pEVar6,pEVar7,
                            (SourceRange *)(lhsExpr_local + 4));
            *(Expression **)((long)location_local + 0x18) = lhsExpr_local[3];
          }
          else {
            local_bc.subsystem = Expressions;
            local_bc.code = 0x1b;
            pSVar2 = &type_local->super_Symbol;
            bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&diag,OutputArg)
            ;
            bVar3 = bitmask<slang::ast::ASTFlags>::has
                              ((bitmask<slang::ast::ASTFlags> *)&(pSVar2->name)._M_str,
                               (bitmask<slang::ast::ASTFlags> *)&diag);
            local_161 = false;
            if (!bVar3) {
              bVar3 = Type::isCastCompatible((Type *)expr_local,(Type *)instance);
              local_171 = true;
              if (!bVar3) {
                local_171 = Type::isBitstreamCastable((Type *)expr_local,(Type *)instance);
              }
              local_161 = local_171;
            }
            if (local_161 != false) {
              local_bc.subsystem = Expressions;
              local_bc.code = 0x70;
            }
            local_d4 = local_bc;
            local_e0 = context_local;
            local_d0 = ASTContext::addDiag((ASTContext *)type_local,local_bc,
                                           (SourceLocation)context_local);
            diag_00 = ast::operator<<(local_d0,(Type *)instance);
            ast::operator<<(diag_00,(Type *)expr_local);
            if (assignFlags_local != (bitmask<slang::ast::AssignFlags> *)0x0) {
              pSVar1 = (SourceRange *)(*(long *)assignFlags_local + 0x20);
              local_f0 = pSVar1->startLoc;
              local_e8 = *(undefined8 *)(*(long *)assignFlags_local + 0x28);
              Diagnostic::operator<<(local_d0,*pSVar1);
            }
            local_100 = ((SourceRange *)(lhsExpr_local + 4))->startLoc;
            local_f8 = lhsExpr_local[5];
            Diagnostic::operator<<(local_d0,*(SourceRange *)(lhsExpr_local + 4));
            location_local =
                 (SourceLocation)badExpr((Compilation *)result,(Expression *)lhsExpr_local);
          }
        }
      }
    }
  }
  return (Expression *)location_local;
}

Assistant:

Expression& Expression::convertAssignment(const ASTContext& context, const Type& type,
                                          Expression& expr, SourceLocation location,
                                          Expression** lhsExpr, bitmask<AssignFlags>* assignFlags) {
    if (expr.bad())
        return expr;

    Compilation& comp = context.getCompilation();
    if (type.isError())
        return badExpr(comp, &expr);

    Expression* result = &expr;
    const Type* rt = expr.type;
    if (type.isEquivalent(*rt)) {
        selfDetermined(context, result);
        return *result;
    }

    // If this is a port connection to an array of instances, check if the provided
    // expression represents an array that should be sliced on a per-instance basis.
    auto instance = context.getInstance();
    if (instance && !instance->arrayPath.empty()) {
        // If the connection is already of the right size and simply differs in
        // terms of four-statedness or signedness, don't bother trying to slice
        // out the connection.
        if (type.getBitWidth() != rt->getBitWidth() || !type.isAssignmentCompatible(*rt)) {
            // If we have an lhsExpr here, this is an output (or inout) port being connected.
            // We need to pass the lhs in as the expression to be connected, since we can't
            // slice the port side. If lhsExpr is null, this is an input port and we should
            // slice the incoming expression as an rvalue.
            if (lhsExpr) {
                Expression* conn = tryConnectPortArray(context, *rt, **lhsExpr, *instance);
                if (conn) {
                    selfDetermined(context, conn);
                    *lhsExpr = conn;

                    ASSERT(assignFlags);
                    if (assignFlags)
                        *assignFlags |= AssignFlags::SlicedPort;

                    selfDetermined(context, result);
                    return *result;
                }
            }
            else {
                Expression* conn = tryConnectPortArray(context, type, expr, *instance);
                if (conn) {
                    selfDetermined(context, conn);
                    return *conn;
                }
            }
        }
    }

    if (!type.isAssignmentCompatible(*rt)) {
        if (expr.isImplicitlyAssignableTo(comp, type)) {
            return ConversionExpression::makeImplicit(context, type, ConversionKind::Implicit,
                                                      *result, location);
        }

        if (expr.kind == ExpressionKind::Streaming) {
            if (Bitstream::canBeSource(type, expr.as<StreamingConcatenationExpression>(), location,
                                       context)) {
                // Add an implicit bit-stream casting otherwise types are not assignment compatible.
                // The size rule is not identical to explicit bit-stream casting so a different
                // ConversionKind is used.
                result = comp.emplace<ConversionExpression>(type, ConversionKind::StreamingConcat,
                                                            *result, result->sourceRange);
                selfDetermined(context, result);
                return *result;
            }
            return badExpr(comp, &expr);
        }
        else if (expr.kind == ExpressionKind::OpenRange) {
            // Convert each side of the range and return that as a new range.
            auto& ore = expr.as<OpenRangeExpression>();
            auto& left = convertAssignment(context, type, ore.left(), location, lhsExpr,
                                           assignFlags);
            auto& right = convertAssignment(context, type, ore.right(), location, lhsExpr,
                                            assignFlags);

            result = comp.emplace<OpenRangeExpression>(*expr.type, left, right, expr.sourceRange);
            result->syntax = expr.syntax;
            return *result;
        }

        DiagCode code = diag::BadAssignment;
        if (!context.flags.has(ASTFlags::OutputArg) &&
            (type.isCastCompatible(*rt) || type.isBitstreamCastable(*rt))) {
            code = diag::NoImplicitConversion;
        }

        auto& diag = context.addDiag(code, location);
        diag << *rt << type;
        if (lhsExpr)
            diag << (*lhsExpr)->sourceRange;

        diag << expr.sourceRange;
        return badExpr(comp, &expr);
    }

    if (type.isNumeric() && rt->isNumeric()) {
        if (context.flags.has(ASTFlags::EnumInitializer) &&
            !checkEnumInitializer(context, type, *result)) {
            return badExpr(comp, &expr);
        }

        // The "signednessFromRt" flag is important here; only the width of the lhs is
        // propagated down to operands, not the sign flag. Once the expression is appropriately
        // sized, the makeImplicit call down below will convert the sign for us.
        rt = binaryOperatorType(comp, &type, rt, false, /* signednessFromRt */ true);
        bool expanding = type.isEquivalent(*rt);
        if (expanding)
            rt = &type;

        contextDetermined(context, result, *rt, location);
        if (expanding)
            return *result;

        // Do not convert (truncate) enum initializer so out of range value can be checked.
        if (context.flags.has(ASTFlags::EnumInitializer)) {
            selfDetermined(context, result);
            return *result;
        }
    }

    return ConversionExpression::makeImplicit(context, type, ConversionKind::Implicit, *result,
                                              location);
}